

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_format(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *__ptr;
  uint uVar7;
  int iVar8;
  bcf_fmt_t *pbVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  kstring_t str;
  
  uVar7 = bcf_hdr_id2int(hdr,0,key);
  if (((int)uVar7 < 0) || ((~(hdr->id[0][uVar7].val)->info[2] & 0xf) == 0)) {
    return -(uint)(n != 0);
  }
  if ((line->unpacked & 8) == 0) {
    bcf_unpack(line,8);
  }
  uVar10 = (uint)(*(ulong *)&line->field_0x10 >> 0x20) & 0xff;
  for (uVar12 = 0; uVar10 << 5 != uVar12; uVar12 = uVar12 + 0x20) {
    if (*(uint *)((long)&((line->d).fmt)->id + uVar12) == uVar7) {
      if (uVar10 << 5 != (int)uVar12) {
        pbVar9 = (line->d).fmt;
        if (n == 0) {
          if (pbVar9 == (bcf_fmt_t *)0x0) {
            return 0;
          }
          if ((int)*(uint *)(&pbVar9->field_0x1c + uVar12) < 0) {
            free((void *)(*(long *)((long)&pbVar9->p + uVar12) -
                         (ulong)(*(uint *)(&pbVar9->field_0x1c + uVar12) & 0x7fffffff)));
            (&pbVar9->field_0x1f)[uVar12] = (&pbVar9->field_0x1f)[uVar12] & 0x7f;
          }
          (line->d).indiv_dirty = 1;
          *(undefined8 *)((long)&pbVar9->p + uVar12) = 0;
          return 0;
        }
        pbVar9 = (bcf_fmt_t *)((long)&pbVar9->id + uVar12);
        goto LAB_001185da;
      }
      break;
    }
  }
  if (n == 0) {
    return 0;
  }
  pbVar9 = (bcf_fmt_t *)0x0;
LAB_001185da:
  uVar10 = hdr->n[2] & 0xffffff;
  *(ulong *)&line->field_0x10 =
       *(ulong *)&line->field_0x10 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
  iVar8 = n / (int)uVar10;
  if ((iVar8 == 0) || (uVar10 * iVar8 != n)) {
    __assert_fail("nps && nps*line->n_sample==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0xae5,
                  "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                 );
  }
  str.l = 0;
  str.m = 0;
  str.s = (char *)0x0;
  bcf_enc_int1(&str,uVar7);
  if (type == 3) {
    bcf_enc_size(&str,iVar8,7);
    iVar8 = iVar8 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28);
  }
  else {
    if (type != 2) {
      if (type != 1) {
        fprintf(_stderr,"[E::%s] the type %d not implemented yet\n","bcf_update_format");
        abort();
      }
      bcf_enc_vint(&str,n,(int32_t *)values,iVar8);
      goto LAB_001186c2;
    }
    bcf_enc_size(&str,iVar8,5);
    iVar8 = iVar8 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28) * 4;
  }
  kputsn((char *)values,iVar8,&str);
LAB_001186c2:
  __ptr = str.s;
  if (pbVar9 == (bcf_fmt_t *)0x0) {
    uVar11 = *(ulong *)&line->field_0x10 + 0x100000000;
    uVar12 = *(ulong *)&line->field_0x10 & 0xffffff00ffffffff | uVar11 & 0xff00000000;
    *(ulong *)&line->field_0x10 = uVar12;
    uVar7 = (uint)(uVar11 >> 0x20) & 0xff;
    iVar8 = (line->d).m_fmt;
    if (iVar8 < (int)uVar7) {
      uVar7 = uVar7 - 1;
      uVar7 = (int)uVar7 >> 1 | uVar7;
      uVar7 = (int)uVar7 >> 2 | uVar7;
      uVar7 = (int)uVar7 >> 4 | uVar7;
      uVar7 = (int)uVar7 >> 8 | uVar7;
      uVar7 = (int)uVar7 >> 0x10 | uVar7;
      (line->d).m_fmt = uVar7 + 1;
      pbVar9 = (bcf_fmt_t *)realloc((line->d).fmt,(long)(int)uVar7 * 0x20 + 0x20);
      (line->d).fmt = pbVar9;
      memset(pbVar9 + iVar8,0,((long)(line->d).m_fmt - (long)iVar8) * 0x20);
      uVar12 = *(ulong *)&line->field_0x10;
    }
    uVar7 = (uint)(uVar12 >> 0x20);
    if (((((uVar12 & 0xfe00000000) == 0) || (*key != 'G')) || (key[1] != 'T')) || (key[2] != '\0'))
    {
      pbVar9 = (bcf_fmt_t *)((long)&(line->d).fmt[-1].id + (ulong)((uVar7 & 0xff) << 5));
    }
    else {
      uVar11 = uVar12 >> 0x20 & 0xff;
      uVar12 = (ulong)(uint)((int)uVar11 << 5);
      for (; 1 < (long)uVar11; uVar11 = uVar11 - 1) {
        pbVar9 = (line->d).fmt;
        puVar1 = (undefined8 *)((long)&pbVar9[-2].id + uVar12);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pbVar9[-2].p + uVar12);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pbVar9[-1].p + uVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)&pbVar9[-1].id + uVar12);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        uVar12 = uVar12 - 0x20;
      }
      uVar7 = (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20);
      pbVar9 = (line->d).fmt;
    }
    bcf_unpack_fmt_core1((uint8_t *)str.s,uVar7 >> 8,pbVar9);
    (line->d).indiv_dirty = 1;
    pbVar9->field_0x1f = pbVar9->field_0x1f | 0x80;
  }
  else {
    uVar7 = *(uint *)&pbVar9->field_0x1c & 0x7fffffff;
    uVar12 = (ulong)(pbVar9->p_len + uVar7);
    if (uVar12 < str.l) {
      if ((int)*(uint *)&pbVar9->field_0x1c < 0) {
        __assert_fail("!fmt->p_free",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0xb1f,
                      "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                     );
      }
      bcf_unpack_fmt_core1
                ((uint8_t *)str.s,(uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),pbVar9);
      pbVar9->field_0x1f = pbVar9->field_0x1f | 0x80;
      (line->d).indiv_dirty = 1;
    }
    else {
      if (str.l != uVar12) {
        (line->d).indiv_dirty = 1;
        uVar7 = *(uint *)&pbVar9->field_0x1c & 0x7fffffff;
      }
      puVar3 = pbVar9->p;
      memcpy(puVar3 + -(ulong)uVar7,str.s,str.l);
      free(__ptr);
      uVar10 = *(uint *)&pbVar9->field_0x1c;
      bcf_unpack_fmt_core1
                (puVar3 + -(ulong)uVar7,(uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28),
                 pbVar9);
      *(uint *)&pbVar9->field_0x1c = *(uint *)&pbVar9->field_0x1c & 0x7fffffff | uVar10 & 0x80000000
      ;
    }
  }
  *(byte *)&line->unpacked = (byte)line->unpacked | 8;
  return 0;
}

Assistant:

int bcf_update_format(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, fmt_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,fmt_id) )
    {
        if ( !n ) return 0;
        return -1;  // the key not present in the header
    }

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==fmt_id ) break;
    bcf_fmt_t *fmt = i==line->n_fmt ? NULL : &line->d.fmt[i];

    if ( !n )
    {
        if ( fmt )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( fmt->p_free )
            {
                free(fmt->p - fmt->p_off);
                fmt->p_free = 0;
            }
            line->d.indiv_dirty = 1;
            fmt->p = NULL;
        }
        return 0;
    }

    line->n_sample = bcf_hdr_nsamples(hdr);
    int nps = n / line->n_sample;  // number of values per sample
    assert( nps && nps*line->n_sample==n );     // must be divisible by n_sample

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, fmt_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, nps);
    else if ( type==BCF_HT_REAL )
    {
        bcf_enc_size(&str, nps, BCF_BT_FLOAT);
        kputsn((char*)values, nps*line->n_sample*sizeof(float), &str);
    }
    else if ( type==BCF_HT_STR )
    {
        bcf_enc_size(&str, nps, BCF_BT_CHAR);
        kputsn((char*)values, nps*line->n_sample, &str);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    if ( !fmt )
    {
        // Not present, new format field
        line->n_fmt++;
        hts_expand0(bcf_fmt_t, line->n_fmt, line->d.m_fmt, line->d.fmt);

        // Special case: VCF specification requires that GT is always first
        if ( line->n_fmt > 1 && key[0]=='G' && key[1]=='T' && !key[2] )
        {
            for (i=line->n_fmt-1; i>0; i--)
                line->d.fmt[i] = line->d.fmt[i-1];
            fmt = &line->d.fmt[0];
        }
        else
            fmt = &line->d.fmt[line->n_fmt-1];
        bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
        line->d.indiv_dirty = 1;
        fmt->p_free = 1;
    }
    else
    {
        // The tag is already present, check if it is big enough to accomodate the new block
        if ( str.l <= fmt->p_len + fmt->p_off )
        {
            // good, the block is big enough
            if ( str.l != fmt->p_len + fmt->p_off ) line->d.indiv_dirty = 1;
            uint8_t *ptr = fmt->p - fmt->p_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int p_free = fmt->p_free;
            bcf_unpack_fmt_core1(ptr, line->n_sample, fmt);
            fmt->p_free = p_free;
        }
        else
        {
            assert( !fmt->p_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
            fmt->p_free = 1;
            line->d.indiv_dirty = 1;
        }
    }
    line->unpacked |= BCF_UN_FMT;
    return 0;
}